

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::find(Value *this,char *begin,char *end)

{
  iterator iVar1;
  Value *pVVar2;
  CZString actualKey;
  String local_1a0;
  key_type local_180 [23];
  
  if (*(char *)&this->bits_ == '\0') {
    pVVar2 = (Value *)0x0;
  }
  else {
    if (*(char *)&this->bits_ != '\a') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
      std::operator<<((ostream *)local_180,
                      "in Json::Value::find(begin, end): requires objectValue or nullValue");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    local_180[0].field_1.index_ = ((int)end - (int)begin) * 4;
    local_180[0].cstr_ = begin;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,local_180);
    pVVar2 = (Value *)0x0;
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      pVVar2 = (Value *)&iVar1._M_node[1]._M_left;
    }
    CZString::~CZString(local_180);
  }
  return pVVar2;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}